

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYRef<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLogLin>
               (GetterXsYRef<long_long> *getter1,GetterXsYRef<long_long> *getter2,
               TransformerLogLin *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  int iVar4;
  ImPlotPlot *pIVar5;
  float fVar6;
  double dVar7;
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  ImPlotContext *pIVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  GetterXsYRef<long_long> *local_50;
  TransformerLogLin *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  pIVar8 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYRef<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLogLin>>
              ((LineSegmentsRenderer<ImPlot::GetterXsYRef<long_long>,_ImPlot::GetterXsYRef<long_long>,_ImPlot::TransformerLogLin>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar11 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar11 = getter1->Count;
    }
    if (0 < iVar11) {
      iVar12 = 0;
      do {
        pIVar9 = GImPlot;
        iVar4 = getter1->Count;
        dVar2 = getter1->YRef;
        dVar13 = log10((double)*(long *)((long)getter1->Xs +
                                        (long)(((getter1->Offset + iVar12) % iVar4 + iVar4) % iVar4)
                                        * (long)getter1->Stride) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar10 = GImPlot;
        pIVar5 = pIVar9->CurrentPlot;
        dVar7 = (pIVar5->XAxis).Range.Min;
        iVar4 = transformer->YAxis;
        IVar3 = pIVar9->PixelRange[iVar4].Min;
        local_58._0_4_ =
             (undefined4)
             (pIVar9->Mx *
              (((double)(float)(dVar13 / pIVar9->LogDenX) * ((pIVar5->XAxis).Range.Max - dVar7) +
               dVar7) - dVar7) + (double)IVar3.x);
        local_58._4_4_ =
             (undefined4)
             (pIVar9->My[iVar4] * (dVar2 - pIVar5->YAxis[iVar4].Range.Min) + (double)IVar3.y);
        iVar4 = getter2->Count;
        dVar2 = getter2->YRef;
        dVar13 = log10((double)*(long *)((long)getter2->Xs +
                                        (long)(((getter2->Offset + iVar12) % iVar4 + iVar4) % iVar4)
                                        * (long)getter2->Stride) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar5 = pIVar10->CurrentPlot;
        dVar7 = (pIVar5->XAxis).Range.Min;
        iVar4 = transformer->YAxis;
        IVar3 = pIVar10->PixelRange[iVar4].Min;
        local_60.x = (float)(pIVar10->Mx *
                             (((double)(float)(dVar13 / pIVar10->LogDenX) *
                               ((pIVar5->XAxis).Range.Max - dVar7) + dVar7) - dVar7) +
                            (double)IVar3.x);
        local_60.y = (float)(pIVar10->My[iVar4] * (dVar2 - pIVar5->YAxis[iVar4].Range.Min) +
                            (double)IVar3.y);
        pIVar5 = pIVar8->CurrentPlot;
        fVar6 = (float)local_58._4_4_;
        if (local_60.y <= (float)local_58._4_4_) {
          fVar6 = local_60.y;
        }
        if ((fVar6 < (pIVar5->PlotRect).Max.y) &&
           (fVar6 = (float)(~-(uint)(local_60.y <= (float)local_58._4_4_) & (uint)local_60.y |
                           local_58._4_4_ & -(uint)(local_60.y <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar5->PlotRect).Min.y, *pfVar1 <= fVar6 && fVar6 != *pfVar1)) {
          fVar6 = (float)local_58._0_4_;
          if (local_60.x <= (float)local_58._0_4_) {
            fVar6 = local_60.x;
          }
          if ((fVar6 < (pIVar5->PlotRect).Max.x) &&
             (fVar6 = (float)(-(uint)(local_60.x <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(local_60.x <= (float)local_58._0_4_) & (uint)local_60.x),
             (pIVar5->PlotRect).Min.x <= fVar6 && fVar6 != (pIVar5->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar12 = iVar12 + 1;
      } while (iVar11 != iVar12);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}